

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O1

parser_error parse_curse_values(parser *p)

{
  bool bVar1;
  errr eVar2;
  errr eVar3;
  parser_error pVar4;
  void *pvVar5;
  char *pcVar6;
  wchar_t index;
  wchar_t value;
  int local_40;
  int local_3c;
  char *local_38;
  
  pvVar5 = parser_priv(p);
  if (pvVar5 == (void *)0x0) {
    pVar4 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    pcVar6 = parser_getstr(p,"values");
    local_38 = string_make(pcVar6);
    pcVar6 = strtok(local_38," |");
    do {
      if (pcVar6 == (char *)0x0) {
        pcVar6 = (char *)0x0;
        break;
      }
      local_3c = 0;
      local_40 = 0;
      eVar2 = grab_index_and_int(&local_3c,&local_40,obj_mods,"",pcVar6);
      if (eVar2 == 0) {
        *(undefined2 *)(*(long *)((long)pvVar5 + 0x18) + 0x52 + (long)local_40 * 2) =
             (undefined2)local_3c;
      }
      eVar3 = grab_index_and_int(&local_3c,&local_40,element_names,"RES_",pcVar6);
      if (eVar3 == 0) {
        *(undefined2 *)(*(long *)((long)pvVar5 + 0x18) + 0x72 + (long)local_40 * 4) =
             (undefined2)local_3c;
LAB_0018a954:
        pcVar6 = strtok((char *)0x0," |");
        bVar1 = true;
      }
      else {
        if (eVar2 == 0) goto LAB_0018a954;
        bVar1 = false;
      }
    } while (bVar1);
    string_free(local_38);
    pVar4 = PARSE_ERROR_INVALID_VALUE;
    if (pcVar6 == (char *)0x0) {
      pVar4 = PARSE_ERROR_NONE;
    }
  }
  return pVar4;
}

Assistant:

static enum parser_error parse_curse_values(struct parser *p) {
	struct curse *curse = parser_priv(p);
	char *s, *t;

	if (!curse) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	s = string_make(parser_getstr(p, "values"));
	t = strtok(s, " |");

	while (t) {
		int value = 0;
		int index = 0;
		bool found = false;
		if (!grab_index_and_int(&value, &index, obj_mods, "", t)) {
			found = true;
			curse->obj->modifiers[index] = value;
		}
		if (!grab_index_and_int(&value, &index, element_names, "RES_", t)) {
			found = true;
			curse->obj->el_info[index].res_level = value;
		}
		if (!found) {
			break;
		}
		t = strtok(NULL, " |");
	}

	string_free(s);
	return t ? PARSE_ERROR_INVALID_VALUE : PARSE_ERROR_NONE;
}